

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O0

vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
* __thiscall
reed_solomn::poly_align
          (reed_solomn *this,vector<__int128,_std::allocator<__int128>_> *A,
          vector<__int128,_std::allocator<__int128>_> *b)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  vector<__int128,_std::allocator<__int128>_> *in_RCX;
  vector<__int128,_std::allocator<__int128>_> *in_RDX;
  value_type *in_RDI;
  int i_1;
  int i;
  int diff;
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  *res;
  value_type *in_stack_ffffffffffffff68;
  undefined4 local_58;
  undefined4 local_2c;
  
  sVar2 = std::vector<__int128,_std::allocator<__int128>_>::size(in_RDX);
  sVar3 = std::vector<__int128,_std::allocator<__int128>_>::size(in_RCX);
  iVar1 = (int)sVar2 - (int)sVar3;
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::vector((vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
            *)0x13aa55);
  if (iVar1 < 1) {
    for (local_58 = 0; local_58 < -iVar1; local_58 = local_58 + 1) {
      std::vector<__int128,_std::allocator<__int128>_>::push_back(in_RDX,in_stack_ffffffffffffff68);
    }
  }
  else {
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      std::vector<__int128,_std::allocator<__int128>_>::push_back(in_RDX,in_stack_ffffffffffffff68);
    }
  }
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::push_back((vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
               *)in_RCX,in_RDI);
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::push_back((vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
               *)in_RCX,in_RDI);
  return (vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
          *)in_RDI;
}

Assistant:

vector<vector<ll128>> reed_solomn::poly_align(vector<ll128> A, vector<ll128> b) {
    int diff = A.size() - b.size();
    vector<vector<ll128>> res;
    if (diff > 0) {
        for (int i = 0; i < diff; ++i) {
            b.push_back(0);
        }
    } else {
        diff = -diff;
        for (int i = 0; i < diff; ++i) {
            A.push_back(0);
        }
    }
    res.push_back(A);
    res.push_back(b);
    return res;
}